

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

int __thiscall phosg::Poll::remove(Poll *this,char *__filename)

{
  pointer *pppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer __dest;
  int iVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  char in_DL;
  ulong uVar8;
  
  ppVar2 = (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar3 = (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar5 = (int)__filename;
  uVar8 = (long)ppVar3 - (long)ppVar2 >> 3;
  while (__dest = ppVar2, 0 < (long)uVar8) {
    uVar7 = uVar8 >> 1;
    uVar8 = ~uVar7 + uVar8;
    ppVar2 = __dest + uVar7 + 1;
    if (iVar5 <= __dest[uVar7].fd) {
      ppVar2 = __dest;
      uVar8 = uVar7;
    }
  }
  iVar4 = (int)uVar8;
  if ((__dest != ppVar3) && (__dest->fd == iVar5)) {
    ppVar2 = __dest + 1;
    if (ppVar2 != ppVar3) {
      pvVar6 = memmove(__dest,ppVar2,(long)ppVar3 - (long)ppVar2);
      iVar4 = (int)pvVar6;
    }
    pppVar1 = &(this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + -1;
    if (in_DL != '\0') {
      iVar5 = close(iVar5);
      return iVar5;
    }
  }
  return iVar4;
}

Assistant:

void Poll::remove(int fd, bool close_fd) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  auto erase_it = lower_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (erase_it != this->poll_fds.end() && erase_it->fd == fd) {
    this->poll_fds.erase(erase_it);
    if (close_fd) {
      close(fd);
    }
  }
}